

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O2

void dump_callerinfo(CallerInfo *callerinfo,char *fn)

{
  void *ptr;
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (dump_callers == '\x01') {
    uVar2 = callerinfo->num_callstack_frames;
    for (uVar3 = 0; uVar3 < callerinfo->trace_scope; uVar3 = uVar3 + 1) {
      printf("    ");
    }
    printf("Call from threadid = %u, stack = {\n",(ulong)callerinfo->threadid);
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    for (uVar4 = 0; uVar4 != uVar2; uVar4 = uVar4 + 1) {
      ptr = callerinfo->callstack[uVar4].frame;
      pcVar1 = callerinfo->callstack[uVar4].sym;
      for (uVar3 = 0; uVar3 < callerinfo->trace_scope; uVar3 = uVar3 + 1) {
        printf("    ");
      }
      if (pcVar1 == (char *)0x0) {
        pcVar1 = ptrString(ptr);
      }
      printf("    %s\n",pcVar1);
    }
    for (uVar2 = 0; uVar2 < callerinfo->trace_scope; uVar2 = uVar2 + 1) {
      printf("    ");
    }
    puts("}");
  }
  if (dump_calls != '\0') {
    return;
  }
  for (uVar2 = 0; uVar2 < callerinfo->trace_scope; uVar2 = uVar2 + 1) {
    printf("    ");
  }
  printf("%s",fn);
  return;
}

Assistant:

static void dump_callerinfo(const CallerInfo *callerinfo, const char *fn)
{
    int i;

    if (dump_callers) {
        const int frames = callerinfo->num_callstack_frames;
        int framei;
        for (i = 0; i < callerinfo->trace_scope; i++) {
            printf("    ");
        }

        printf("Call from threadid = %u, stack = {\n", (uint) callerinfo->threadid);

        for (framei = 0; framei < frames; framei++) {
            void *ptr = callerinfo->callstack[framei].frame;
            const char *str = callerinfo->callstack[framei].sym;
            for (i = 0; i < callerinfo->trace_scope; i++) {
                printf("    ");
            }
            printf("    %s\n", str ? str : ptrString(ptr));
        }

        for (i = 0; i < callerinfo->trace_scope; i++) {
            printf("    ");
        }
        printf("}\n");
    }

    if (dump_calls) {
        for (i = 0; i < callerinfo->trace_scope; i++) {
            printf("    ");
        }
        printf("%s", fn);
    }
}